

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

int __thiscall
ImFontAtlas::AddCustomRectFontGlyph
          (ImFontAtlas *this,ImFont *font,ImWchar id,int width,int height,float advance_x,
          ImVec2 *offset)

{
  ImVec2 IVar1;
  int iVar2;
  ImFontAtlasCustomRect *pIVar3;
  ImFontAtlasCustomRect *__dest;
  int iVar4;
  int iVar5;
  
  IVar1 = *offset;
  iVar5 = (this->CustomRects).Size;
  iVar2 = (this->CustomRects).Capacity;
  if (iVar5 == iVar2) {
    iVar5 = iVar5 + 1;
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar2 < iVar5) {
      __dest = (ImFontAtlasCustomRect *)ImGui::MemAlloc((long)iVar5 << 5);
      pIVar3 = (this->CustomRects).Data;
      if (pIVar3 != (ImFontAtlasCustomRect *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->CustomRects).Size << 5);
        ImGui::MemFree((this->CustomRects).Data);
      }
      (this->CustomRects).Data = __dest;
      (this->CustomRects).Capacity = iVar5;
    }
  }
  pIVar3 = (this->CustomRects).Data;
  iVar5 = (this->CustomRects).Size;
  pIVar3[iVar5].ID = (uint)id;
  pIVar3[iVar5].Width = (unsigned_short)width;
  pIVar3[iVar5].Height = (unsigned_short)height;
  pIVar3[iVar5].X = 0xffff;
  pIVar3[iVar5].Y = 0xffff;
  pIVar3[iVar5].GlyphAdvanceX = advance_x;
  pIVar3[iVar5].GlyphOffset = IVar1;
  pIVar3[iVar5].Font = font;
  iVar5 = (this->CustomRects).Size;
  (this->CustomRects).Size = iVar5 + 1;
  return iVar5;
}

Assistant:

int ImFontAtlas::AddCustomRectFontGlyph(ImFont* font, ImWchar id, int width, int height, float advance_x, const ImVec2& offset)
{
    IM_ASSERT(font != NULL);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    r.GlyphAdvanceX = advance_x;
    r.GlyphOffset = offset;
    r.Font = font;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}